

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  int n_col_00;
  ulong uVar5;
  char *__s;
  int n_col_1;
  int n_col;
  uint uVar6;
  uint local_c8;
  m256v Msl;
  m2v Mss;
  m2v Bs;
  m256v Mtl;
  m2v local_60;
  m256v Cl;
  
  while (iVar4 = getopt(argc,argv,"h"), iVar4 != -1) {
    if (iVar4 == 0x3f) {
      exit(1);
    }
    if (iVar4 == 0x68) {
      usage();
      exit(0);
    }
  }
  puts("Running: test_el_access()");
  _Var2 = test_el_access();
  __s = "--> FAIL (test test_el_access())";
  if (_Var2) {
    __s = "--> pass";
  }
  puts(__s);
  puts("Running: run_mat_pair_test(mptest_el_access2)");
  _Var3 = run_mat_pair_test(mptest_el_access2);
  if (_Var3) {
    local_c8 = (uint)!_Var2;
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_el_access2))");
    local_c8 = 2 - _Var2;
  }
  puts("Running: run_mat_pair_test(mptest_testfuncs)");
  _Var2 = run_mat_pair_test(mptest_testfuncs);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_testfuncs))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_swap_rows)");
  _Var2 = run_mat_pair_test(mptest_swap_rows);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_swap_rows))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_clear_row)");
  _Var2 = run_mat_pair_test(mptest_clear_row);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_clear_row))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_multadd_row)");
  _Var2 = run_mat_pair_test(mptest_multadd_row);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_multadd_row))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_multadd_row_from)");
  _Var2 = run_mat_pair_test(mptest_multadd_row_from);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_multadd_row_from))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_copy_row)");
  _Var2 = run_mat_pair_test(mptest_copy_row);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_copy_row))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_row_iszero)");
  _Var2 = run_mat_pair_test(mptest_row_iszero);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_row_iszero))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_swap_cols)");
  _Var2 = run_mat_pair_test(mptest_swap_cols);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_swap_cols))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_mult_col_from)");
  _Var2 = run_mat_pair_test(mptest_mult_col_from);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_mult_col_from))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_copy_col)");
  _Var2 = run_mat_pair_test(mptest_copy_col);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_copy_col))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_iszero)");
  _Var2 = run_mat_pair_test(mptest_iszero);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_iszero))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_clear)");
  _Var2 = run_mat_pair_test(mptest_clear);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_clear))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: test_copy()");
  lVar1 = 3;
  while( true ) {
    n_col_00 = 3;
    iVar4 = (int)lVar1;
    if (0x31 < iVar4) break;
    for (; n_col_00 < 0x82; n_col_00 = ((n_col_00 * 5) / 2) * n_col_00) {
      get_mat_pair(iVar4,n_col_00,&Msl,&Mss);
      get_mat_pair(iVar4,n_col_00,&Mtl,&Bs);
      clobber_m2v(&Bs);
      m2v_copy(&Mss,&Bs);
      m256v_copy(&Msl,&Mtl);
      _Var2 = check_mat_pair_equal(&Mtl,&Bs);
      free_mat_pair_mem(&Mtl,&Bs);
      free_mat_pair_mem(&Msl,&Mss);
      if (!_Var2) {
        puts("--> FAIL (test test_copy())");
        local_c8 = local_c8 + 1;
        goto LAB_001015f3;
      }
    }
    lVar1 = (long)(iVar4 * 5) / 2;
  }
  puts("--> pass");
LAB_001015f3:
  puts("Running: run_mat_pair_test(mptest_permute_rows)");
  _Var2 = run_mat_pair_test(mptest_permute_rows);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_permute_rows))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_permute_cols)");
  _Var2 = run_mat_pair_test(mptest_permute_cols);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_permute_cols))");
    local_c8 = local_c8 + 1;
  }
  puts("Running: test_add()");
  lVar1 = 10;
  while( true ) {
    uVar6 = 10;
    iVar4 = (int)lVar1;
    if (0x31 < iVar4) break;
    for (; uVar6 < 0x54; uVar6 = uVar6 * ((uVar6 * 0x11 & 0xffff) / 10)) {
      get_mat_pair(iVar4,uVar6,&Msl,&Mss);
      get_mat_pair(iVar4,uVar6,&Mtl,&Bs);
      get_mat_pair(iVar4,uVar6,&Cl,&local_60);
      clobber_m2v(&local_60);
      m2v_add(&Mss,&Bs,&local_60);
      m256v_add(&Msl,&Mtl,&Cl);
      _Var2 = check_mat_pair_equal(&Cl,&local_60);
      free_mat_pair_mem(&Cl,&local_60);
      free_mat_pair_mem(&Mtl,&Bs);
      free_mat_pair_mem(&Msl,&Mss);
      if (!_Var2) {
        puts("--> FAIL (test test_add())");
        local_c8 = local_c8 + 1;
        goto LAB_0010177d;
      }
    }
    lVar1 = (long)(iVar4 * 0x11) / 10;
  }
  puts("--> pass");
LAB_0010177d:
  puts("Running: test_add_inplace()");
  lVar1 = 7;
  while( true ) {
    uVar6 = 7;
    iVar4 = (int)lVar1;
    if (0x31 < iVar4) break;
    for (; uVar6 < 0x32; uVar6 = uVar6 * ((uVar6 * 0x13 & 0xffff) / 10)) {
      get_mat_pair(iVar4,uVar6,&Msl,&Mss);
      get_mat_pair(iVar4,uVar6,&Mtl,&Bs);
      m2v_add_inplace(&Mss,&Bs);
      m256v_add_inplace(&Msl,&Mtl);
      _Var2 = check_mat_pair_equal(&Mtl,&Bs);
      free_mat_pair_mem(&Mtl,&Bs);
      free_mat_pair_mem(&Msl,&Mss);
      if (!_Var2) {
        puts("--> FAIL (test test_add_inplace())");
        local_c8 = local_c8 + 1;
        goto LAB_0010185a;
      }
    }
    lVar1 = (long)(iVar4 * 0x13) / 10;
  }
  puts("--> pass");
LAB_0010185a:
  puts("Running: test_mul()");
  uVar5 = 10;
  do {
    iVar4 = (int)uVar5;
    if (0x31 < iVar4) {
      puts("--> pass");
LAB_0010197b:
      return (uint)(local_c8 != 0);
    }
    for (uVar6 = 10; uVar6 < 0x54; uVar6 = uVar6 * ((uVar6 * 0x11 & 0xffff) / 10)) {
      get_mat_pair(iVar4,99,&Msl,&Mss);
      get_mat_pair(99,uVar6,&Mtl,&Bs);
      get_mat_pair(iVar4,uVar6,&Cl,&local_60);
      clobber_m2v(&local_60);
      m2v_mul(&Mss,&Bs,&local_60);
      m256v_mul(&Msl,&Mtl,&Cl);
      _Var2 = check_mat_pair_equal(&Cl,&local_60);
      free_mat_pair_mem(&Cl,&local_60);
      free_mat_pair_mem(&Mtl,&Bs);
      free_mat_pair_mem(&Msl,&Mss);
      if (!_Var2) {
        puts("--> FAIL (test test_mul())");
        local_c8 = local_c8 + 1;
        goto LAB_0010197b;
      }
    }
    uVar5 = (long)(iVar4 * 0x11) / 10 & 0xffffffff;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
	/* Read cmdline args */
	int c;
	while ((c = getopt(argc, argv, "h")) != -1) {
		switch(c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	int nfail = 0;
#define RUN_TEST(x) \
	do { \
		printf("Running: " #x "\n"); \
		if (!x) { \
			printf("--> FAIL (test " #x ")\n"); \
			++nfail; \
		} else { \
			printf("--> pass\n"); \
		} \
	} while(0)

	// Tests for the elementary ops on submatrices
	RUN_TEST(test_el_access());
	RUN_TEST(run_mat_pair_test(mptest_el_access2));
	RUN_TEST(run_mat_pair_test(mptest_testfuncs));
	RUN_TEST(run_mat_pair_test(mptest_swap_rows));
	RUN_TEST(run_mat_pair_test(mptest_clear_row));
	RUN_TEST(run_mat_pair_test(mptest_multadd_row));
	RUN_TEST(run_mat_pair_test(mptest_multadd_row_from));
	RUN_TEST(run_mat_pair_test(mptest_copy_row));
	RUN_TEST(run_mat_pair_test(mptest_row_iszero));
	RUN_TEST(run_mat_pair_test(mptest_swap_cols));
	RUN_TEST(run_mat_pair_test(mptest_mult_col_from));
	RUN_TEST(run_mat_pair_test(mptest_copy_col));

	// Tests for the entire matrix
	RUN_TEST(run_mat_pair_test(mptest_iszero));
	RUN_TEST(run_mat_pair_test(mptest_clear));
	RUN_TEST(test_copy());
	RUN_TEST(run_mat_pair_test(mptest_permute_rows));
	RUN_TEST(run_mat_pair_test(mptest_permute_cols));
	RUN_TEST(test_add());
	RUN_TEST(test_add_inplace());
	RUN_TEST(test_mul());
#undef RUN_TEST

	return (nfail == 0 ? EXIT_SUCCESS : EXIT_FAILURE);
}